

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_line_section.cpp
# Opt level: O1

ssize_t __thiscall
pstore::repo::debug_line_section_creation_dispatcher::write
          (debug_line_section_creation_dispatcher *this,int __fd,void *__buf,size_t __n)

{
  uint8_t align;
  section_content *psVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  undefined4 in_register_00000034;
  undefined8 *puVar6;
  pair<pstore::pointer_based_iterator<const_unsigned_char>,_pstore::pointer_based_iterator<const_unsigned_char>_>
  local_40;
  pair<__gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>
  local_30;
  pair<__gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>
  local_20;
  
  puVar6 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  iVar4 = (*(this->super_section_creation_dispatcher)._vptr_section_creation_dispatcher[4])();
  if ((undefined8 *)CONCAT44(extraout_var,iVar4) == puVar6) {
    psVar1 = this->section_;
    local_40.first.pos_ = (psVar1->data).buffer_;
    local_40.second.pos_ = local_40.first.pos_ + (psVar1->data).elements_;
    local_30.first._M_current =
         (psVar1->ifixups).
         super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_30.second._M_current =
         (psVar1->ifixups).
         super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_20.first._M_current =
         (psVar1->xfixups).
         super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_20.second._M_current =
         (psVar1->xfixups).
         super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    align = psVar1->align;
    uVar2 = *(undefined8 *)((long)&(this->header_digest_).v_ + 8);
    *puVar6 = (long)(this->header_digest_).v_;
    puVar6[1] = uVar2;
    uVar3 = (this->header_).size;
    puVar6[2] = (this->header_).addr.a_.a_;
    puVar6[3] = uVar3;
    generic_section::
    generic_section<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
              ((generic_section *)(puVar6 + 4),&local_40,&local_30,&local_20,align);
    sVar5 = generic_section::size_bytes((generic_section *)(puVar6 + 4));
    return (long)puVar6 + sVar5 + 0x20;
  }
  assert_failed("this->aligned (out) == out",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/debug_line_section.cpp"
                ,0x21);
}

Assistant:

std::uint8_t *
        debug_line_section_creation_dispatcher::write (std::uint8_t * const out) const {
            PSTORE_ASSERT (this->aligned (out) == out);
            auto * const scn = new (out) debug_line_section (
                header_digest_, header_, section_->make_sources (), section_->align);
            return out + scn->size_bytes ();
        }